

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
SetInstance::SetInstance
          (SetInstance *this,string *element_type,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  _Rb_tree_header *p_Var1;
  string *str;
  bool bVar2;
  undefined8 *puVar3;
  char *pcVar4;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"Set",&local_51);
  Instance::Instance(&this->super_Instance,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__SetInstance_0017bf40;
  (this->_element_type)._M_dataplus._M_p = (pointer)&(this->_element_type).field_2;
  (this->_element_type)._M_string_length = 0;
  (this->_element_type).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_value)._M_t._M_impl.super__Rb_tree_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->_element_type);
  bVar2 = std::operator==(message_name,"create:");
  if (!bVar2) {
    bVar2 = std::operator==(message_name,"createIfNotExists:");
    if (!bVar2) {
      pcVar4 = "RuntimeError: invalid message.";
      goto LAB_0015751d;
    }
  }
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar2 = Grammar::is_variable(str);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
      return;
    }
    pcVar4 = "RuntimeError: invalid argument.";
  }
  else {
    pcVar4 = "RuntimeError: wrong number of arguments.";
  }
LAB_0015751d:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

SetInstance::SetInstance(const std::string& element_type, const std::string& message_name,
                         const std::vector<std::string>& arguments) : Instance("Set") {
    _element_type = element_type;
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
    }
    else
        throw EXC_INVALID_MESSAGE;
}